

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.h
# Opt level: O1

void __thiscall vector<server::savedscore>::growbuf(vector<server::savedscore> *this,int sz)

{
  uint uVar1;
  savedscore *__src;
  int iVar2;
  savedscore *__dest;
  
  uVar1 = this->alen;
  if ((ulong)uVar1 == 0) {
    iVar2 = 8;
    if (8 < sz) {
      iVar2 = sz;
    }
  }
  else {
    iVar2 = this->alen;
    if (sz <= iVar2) goto LAB_0014c0df;
    do {
      iVar2 = iVar2 * 2;
    } while (iVar2 < sz);
  }
  this->alen = iVar2;
LAB_0014c0df:
  if ((int)uVar1 < this->alen) {
    __dest = (savedscore *)operator_new__((long)this->alen * 0x128);
    if (0 < (int)uVar1) {
      __src = this->buf;
      memcpy(__dest,__src,(ulong)uVar1 * 0x128);
      if (__src != (savedscore *)0x0) {
        operator_delete__(__src);
      }
    }
    this->buf = __dest;
  }
  return;
}

Assistant:

void growbuf(int sz)
    {
        int olen = alen;
        if(!alen) alen = max(MINSIZE, sz);
        else while(alen < sz) alen *= 2;
        if(alen <= olen) return;
        uchar *newbuf = new uchar[alen*sizeof(T)];
        if(olen > 0)
        {
            memcpy(newbuf, (void *)buf, olen*sizeof(T));
            delete[] (uchar *)buf;
        }
        buf = (T *)newbuf;
    }